

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialogPrivate::hideDefault(QDialogPrivate *this)

{
  long lVar1;
  QDialog *pQVar2;
  QList<QPushButton_*> *this_00;
  qsizetype qVar3;
  QDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  QDialog *q;
  QList<QPushButton_*> list;
  undefined4 in_stack_ffffffffffffffa8;
  FindChildOption in_stack_ffffffffffffffac;
  QFlags<Qt::FindChildOption> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  Data *local_20;
  QFlagsStorage<Qt::FindChildOption> options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  options.i = 0xaaaaaaaa;
  QFlags<Qt::FindChildOption>::QFlags(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QObject::findChildren<QPushButton*>
            ((QObject *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (FindChildOptions)options.i);
  iVar4 = 0;
  while( true ) {
    this_00 = (QList<QPushButton_*> *)(long)iVar4;
    qVar3 = QList<QPushButton_*>::size((QList<QPushButton_*> *)&local_20);
    if (qVar3 <= (long)this_00) break;
    QList<QPushButton_*>::at(this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QPushButton::setDefault
              ((QPushButton *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
               SUB81((ulong)pQVar2 >> 0x38,0));
    iVar4 = iVar4 + 1;
  }
  QList<QPushButton_*>::~QList((QList<QPushButton_*> *)0x743ab3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogPrivate::hideDefault()
{
    Q_Q(QDialog);
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        list.at(i)->setDefault(false);
    }
}